

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::EndArray(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,SizeType elementCount)

{
  ValueType *pVVar1;
  Ch *pCVar2;
  SizeType elementCount_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  context->inArray = false;
  if (elementCount < this->minItems_) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0xf])
              (context->error_handler,(ulong)elementCount,(ulong)this->minItems_);
    context->invalidCode = kValidateErrorMinItems;
    pVVar1 = GetValidateErrorKeyword(kValidateErrorMinItems);
    pCVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar1);
    context->invalidKeyword = pCVar2;
    this_local._7_1_ = false;
  }
  else if (this->maxItems_ < elementCount) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x10])
              (context->error_handler,(ulong)elementCount,(ulong)this->maxItems_);
    context->invalidCode = kValidateErrorMaxItems;
    pVVar1 = GetValidateErrorKeyword(kValidateErrorMaxItems);
    pCVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar1);
    context->invalidKeyword = pCVar2;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool EndArray(Context& context, SizeType elementCount) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::EndArray");
        context.inArray = false;

        if (elementCount < minItems_) {
            context.error_handler.TooFewItems(elementCount, minItems_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMinItems);
        }

        if (elementCount > maxItems_) {
            context.error_handler.TooManyItems(elementCount, maxItems_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMaxItems);
        }

        return true;
    }